

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O0

void Rwt_ManIncTravId(Rwt_Man_t *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  int local_1c;
  int i;
  Rwt_Node_t *pNode;
  Rwt_Man_t *p_local;
  
  uVar1 = p->nTravIds;
  p->nTravIds = uVar1 + 1;
  if (0x8ffffffe < uVar1) {
    for (local_1c = 0; iVar2 = Vec_PtrSize(p->vForest), local_1c < iVar2; local_1c = local_1c + 1) {
      pvVar3 = Vec_PtrEntry(p->vForest,local_1c);
      *(undefined4 *)((long)pvVar3 + 4) = 0;
    }
    p->nTravIds = 1;
  }
  return;
}

Assistant:

void Rwt_ManIncTravId( Rwt_Man_t * p )
{
    Rwt_Node_t * pNode;
    int i;
    if ( p->nTravIds++ < 0x8FFFFFFF )
        return;
    Vec_PtrForEachEntry( Rwt_Node_t *, p->vForest, pNode, i )
        pNode->TravId = 0;
    p->nTravIds = 1;
}